

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  ulong uVar10;
  char *__ptr;
  long lVar11;
  xmlChar *pxVar12;
  size_t sVar13;
  long lVar14;
  int i;
  size_t num_keys;
  ulong uVar15;
  size_t sStack_70;
  xmlChar local_58 [40];
  
  xmlCheckVersion(0x5398);
  strings1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings1,0,800000);
  strings2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings2,0,800000);
  test1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test1,0,800000);
  test2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test2,0,800000);
  fill_string_pool(strings1,seeds1);
  fill_string_pool(strings2,seeds2);
  lVar7 = xmlDictCreate();
  if (lVar7 == 0) {
    __ptr = "Out of memory while creating dictionary\n";
    sStack_70 = 0x28;
  }
  else {
    *test1 = (xmlChar *)0x0;
    bVar3 = false;
    for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
      pxVar8 = (xmlChar *)xmlDictLookup(lVar7,strings1[lVar11],0xffffffff);
      test1[lVar11] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[lVar11]);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
      pxVar8 = strings1[lVar11 + 90000];
      uVar4 = xmlStrlen(pxVar8);
      pxVar8 = (xmlChar *)xmlDictLookup(lVar7,pxVar8,uVar4);
      test1[lVar11 + 90000] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[lVar11 + 90000]);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
      pxVar8 = strings1[lVar11 + 0x18696];
      uVar4 = xmlStrlen(pxVar8);
      pxVar8 = (xmlChar *)xmlDictLookup(lVar7,pxVar8,uVar4);
      test1[lVar11 + 0x18696] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[lVar11 + 0x18696]);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    for (lVar11 = 0; lVar11 != 100000; lVar11 = lVar11 + 1) {
      if (test1[lVar11] == (xmlChar *)0x0) {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar7,strings1[lVar11],0xffffffff);
        test1[lVar11] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[lVar11]);
          nbErrors = nbErrors + 1;
          bVar3 = true;
        }
      }
    }
    for (lVar11 = 0; lVar11 != 100000; lVar11 = lVar11 + 1) {
      iVar5 = xmlDictOwns(lVar7,test1[lVar11]);
      if (iVar5 == 0) {
        fprintf(_stderr,"Failed ownership failure for \'%s\'\n",strings1[lVar11]);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    for (uVar15 = 0; uVar15 != 100000; uVar15 = uVar15 + 1) {
      pxVar8 = (xmlChar *)xmlDictLookup(lVar7,strings1[uVar15],0xffffffff);
      if (pxVar8 != test1[uVar15]) {
        fprintf(_stderr,"Failed re-lookup check for %d, \'%s\'\n",uVar15 & 0xffffffff,
                strings1[uVar15]);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    for (lVar11 = 90000; lVar11 != 100000; lVar11 = lVar11 + 1) {
      pxVar9 = local_58;
      pxVar8 = strings1[lVar11];
      while( true ) {
        pxVar12 = pxVar8 + 1;
        if (*pxVar8 == ':') break;
        *pxVar9 = *pxVar8;
        pxVar9 = pxVar9 + 1;
        pxVar8 = pxVar12;
      }
      *pxVar9 = '\0';
      pxVar8 = (xmlChar *)xmlDictQLookup(lVar7,local_58,pxVar12);
      if (pxVar8 != test1[lVar11]) {
        fprintf(_stderr,"Failed lookup check for \'%s\':\'%s\'\n",local_58,pxVar12);
        nbErrors = nbErrors + 1;
        bVar3 = true;
      }
    }
    lVar11 = xmlDictCreateSub(lVar7);
    if (lVar11 != 0) {
      *test2 = (xmlChar *)0x0;
      bVar2 = false;
      for (lVar14 = 0; lVar14 != 10; lVar14 = lVar14 + 1) {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar11,strings2[lVar14],0xffffffff);
        test2[lVar14] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[lVar14]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 0; lVar14 != 10; lVar14 = lVar14 + 1) {
        pxVar8 = strings2[lVar14 + 90000];
        uVar4 = xmlStrlen(pxVar8);
        pxVar8 = (xmlChar *)xmlDictLookup(lVar11,pxVar8,uVar4);
        test2[lVar14 + 90000] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[lVar14 + 90000]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 0; lVar14 != 10; lVar14 = lVar14 + 1) {
        pxVar8 = strings2[lVar14 + 0x18696];
        uVar4 = xmlStrlen(pxVar8);
        pxVar8 = (xmlChar *)xmlDictLookup(lVar11,pxVar8,uVar4);
        test2[lVar14 + 0x18696] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[lVar14 + 0x18696]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 0; lVar14 != 100000; lVar14 = lVar14 + 1) {
        if (test2[lVar14] == (xmlChar *)0x0) {
          pxVar8 = (xmlChar *)xmlDictLookup(lVar11,strings2[lVar14],0xffffffff);
          test2[lVar14] = pxVar8;
          if (pxVar8 == (xmlChar *)0x0) {
            fprintf(_stderr,"Failed lookup for \'%s\'\n",strings2[lVar14]);
            nbErrors = nbErrors + 1;
            bVar2 = true;
          }
        }
      }
      for (lVar14 = 0; lVar14 != 100000; lVar14 = lVar14 + 1) {
        iVar5 = xmlDictOwns(lVar11,test2[lVar14]);
        if (iVar5 == 0) {
          fprintf(_stderr,"Failed ownership failure for \'%s\'\n",strings2[lVar14]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
        iVar5 = xmlDictOwns(lVar7,test2[lVar14]);
        if (iVar5 != 0) {
          fprintf(_stderr,"Failed parent ownership failure for \'%s\'\n",strings2[lVar14]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 0; lVar14 != 100000; lVar14 = lVar14 + 1) {
        iVar5 = xmlDictOwns(lVar11,test1[lVar14]);
        if (iVar5 == 0) {
          fprintf(_stderr,"Failed sub-ownership failure for \'%s\'\n",strings1[lVar14]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (uVar15 = 0; uVar15 != 100000; uVar15 = uVar15 + 1) {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar11,strings2[uVar15],0xffffffff);
        if (pxVar8 != test2[uVar15]) {
          fprintf(_stderr,"Failed re-lookup check for %d, \'%s\'\n",uVar15 & 0xffffffff,
                  strings2[uVar15]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (uVar15 = 0; uVar15 != 100000; uVar15 = uVar15 + 1) {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar11,strings1[uVar15],0xffffffff);
        if (pxVar8 != test1[uVar15]) {
          fprintf(_stderr,"Failed parent string lookup check for %d, \'%s\'\n",uVar15 & 0xffffffff,
                  strings1[uVar15]);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 90000; lVar14 != 100000; lVar14 = lVar14 + 1) {
        pxVar9 = local_58;
        pxVar8 = strings2[lVar14];
        while( true ) {
          pxVar12 = pxVar8 + 1;
          if (*pxVar8 == ':') break;
          *pxVar9 = *pxVar8;
          pxVar9 = pxVar9 + 1;
          pxVar8 = pxVar12;
        }
        *pxVar9 = '\0';
        pxVar8 = (xmlChar *)xmlDictQLookup(lVar11,local_58,pxVar12);
        if (pxVar8 != test2[lVar14]) {
          fprintf(_stderr,"Failed lookup check for \'%s\':\'%s\'\n",local_58,pxVar12);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      for (lVar14 = 90000; lVar14 != 100000; lVar14 = lVar14 + 1) {
        pxVar9 = local_58;
        pxVar8 = strings1[lVar14];
        while( true ) {
          pxVar12 = pxVar8 + 1;
          if (*pxVar8 == ':') break;
          *pxVar9 = *pxVar8;
          pxVar9 = pxVar9 + 1;
          pxVar8 = pxVar12;
        }
        *pxVar9 = '\0';
        xmlDictQLookup(lVar11,local_58,pxVar12);
        pxVar8 = (xmlChar *)xmlDictQLookup(lVar11,local_58,pxVar12);
        if (pxVar8 != test1[lVar14]) {
          fprintf(_stderr,"Failed parent lookup check for \'%s\':\'%s\'\n",local_58,pxVar12);
          nbErrors = nbErrors + 1;
          bVar2 = true;
        }
      }
      xmlDictFree(lVar11);
      xmlDictFree(lVar7);
      for (lVar7 = 0; lVar7 != 100000; lVar7 = lVar7 + 1) {
        if (strings1[lVar7] != (xmlChar *)0x0) {
          (*_xmlFree)();
        }
      }
      for (lVar7 = 0; lVar7 != 100000; lVar7 = lVar7 + 1) {
        if (strings2[lVar7] != (xmlChar *)0x0) {
          (*_xmlFree)();
        }
      }
      (*_xmlFree)(strings1);
      (*_xmlFree)(strings2);
      (*_xmlFree)(test1);
      (*_xmlFree)(test2);
      if (bVar2 || bVar3) {
        fwrite("dictionary tests failed\n",0x18,1,_stderr);
      }
      uVar6 = (uint)(bVar2 || bVar3);
      num_keys = 1;
      do {
        uVar15 = 10;
        if (num_keys == 4) {
LAB_00102daf:
          xmlCleanupParser();
          return uVar6;
        }
        uVar10 = 1000;
        if (num_keys == 1) {
          uVar10 = 100000;
        }
        for (; uVar15 <= uVar10; uVar15 = uVar15 * 10) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar15;
          sVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar1,0);
          if (1000 < uVar15) {
            sVar13 = 1;
          }
          lVar7 = sVar13 + 1;
          while (lVar7 = lVar7 + -1, lVar7 != 0) {
            iVar5 = test_hash(uVar15,num_keys,0);
            if (iVar5 != 0) goto LAB_00102d93;
          }
          iVar5 = test_hash(uVar15,num_keys,1);
          if (iVar5 != 0) {
LAB_00102d93:
            fwrite("hash tests failed\n",0x12,1,_stderr);
            uVar6 = 1;
            goto LAB_00102daf;
          }
        }
        num_keys = num_keys + 1;
      } while( true );
    }
    __ptr = "Out of memory while creating sub-dictionary\n";
    sStack_70 = 0x2c;
  }
  fwrite(__ptr,sStack_70,1,_stderr);
  exit(1);
}

Assistant:

int
main(void) {
    int ret = 0;

    LIBXML_TEST_VERSION

    if (testall_dict() != 0) {
        fprintf(stderr, "dictionary tests failed\n");
        ret = 1;
    }
    if (testall_hash() != 0) {
        fprintf(stderr, "hash tests failed\n");
        ret = 1;
    }

    xmlCleanupParser();
    return(ret);
}